

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

FString ScriptPresentation(int script)

{
  FString *pFVar1;
  FString FVar2;
  char *extraout_RAX;
  uint in_ESI;
  undefined4 in_register_0000003c;
  
  pFVar1 = (FString *)CONCAT44(in_register_0000003c,script);
  FString::FString(pFVar1,"script ");
  if (((int)in_ESI < 0) && (-in_ESI < (uint)FName::NameData.NumNames)) {
    pFVar1 = FString::operator+=(pFVar1,'\"');
    pFVar1 = FString::operator+=(pFVar1,FName::NameData.NameArray[-in_ESI].Text);
    FVar2.Chars = (char *)FString::operator+=(pFVar1,'\"');
  }
  else {
    FString::AppendFormat(pFVar1,"%d",(ulong)in_ESI);
    FVar2.Chars = extraout_RAX;
  }
  return (FString)FVar2.Chars;
}

Assistant:

static FString ScriptPresentation(int script)
{
	FString out = "script ";

	if (script < 0)
	{
		FName scrname = FName(ENamedName(-script));
		if (scrname.IsValidName())
		{
			out << '"' << scrname.GetChars() << '"';
			return out;
		}
	}
	out.AppendFormat("%d", script);
	return out;
}